

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

mz_bool mz_zip_reader_read_central_dir(mz_zip_archive *pZip,mz_uint flags)

{
  ushort uVar1;
  mz_bool mVar2;
  uint uVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  ulong local_13b0;
  ulong local_13a8;
  ulong local_13a0;
  mz_uint32 field_data_size;
  mz_uint32 field_id;
  void *buf;
  mz_uint8 *pExtra_data;
  mz_uint32 extra_size_remaining;
  mz_uint64 local_header_ofs;
  mz_uint64 decomp_size;
  mz_uint64 comp_size;
  mz_uint ext_data_size;
  mz_uint filename_size;
  mz_uint bit_flags;
  mz_uint disk_index;
  mz_uint total_header_size;
  mz_uint n;
  mz_uint i;
  mz_uint64 zip64_size_of_central_directory;
  mz_uint64 zip64_size_of_end_of_central_dir_record;
  mz_uint64 zip64_cdir_total_entries_on_this_disk;
  mz_uint64 zip64_cdir_total_entries;
  mz_uint32 zip64_total_num_of_disks;
  mz_uint64 zip64_end_of_central_dir_ofs;
  mz_uint8 *pZip64_end_of_central_dir;
  mz_uint32 zip64_end_of_central_dir_header_u32 [14];
  mz_uint8 *pZip64_locator;
  mz_uint32 zip64_end_of_central_dir_locator_u32 [5];
  mz_bool sort_central_dir;
  mz_uint8 *pBuf;
  mz_uint32 buf_u32 [1024];
  mz_uint8 *p;
  mz_int64 cur_file_ofs;
  mz_uint64 archive_ofs;
  mz_uint64 eocd_ofs;
  mz_uint64 cdir_ofs;
  uint local_278;
  mz_uint cdir_disk_index;
  mz_uint num_this_disk;
  mz_uint cdir_entries_on_this_disk;
  mz_uint cdir_size;
  mz_uint flags_local;
  mz_zip_archive *pZip_local;
  undefined4 local_6c;
  ulong local_68;
  mz_zip_array *local_60;
  mz_zip_archive *local_58;
  int local_50;
  undefined4 local_4c;
  ulong local_48;
  mz_zip_array *local_40;
  mz_zip_archive *local_38;
  int local_30;
  undefined4 local_2c;
  size_t local_28;
  mz_zip_internal_state *local_20;
  mz_zip_archive *local_18;
  int local_c;
  
  num_this_disk = 0;
  cdir_disk_index = 0;
  local_278 = 0;
  cdir_ofs._4_4_ = 0;
  eocd_ofs = 0;
  archive_ofs = 0;
  cur_file_ofs = 0;
  p = (mz_uint8 *)0x0;
  unique0x00004880 = &pBuf;
  zip64_end_of_central_dir_locator_u32[3] = (mz_uint32)((flags & 0x800) == 0);
  zip64_end_of_central_dir_header_u32._48_8_ = &pZip64_locator;
  if (pZip->m_archive_size < 0x16) {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_NOT_AN_ARCHIVE;
    }
    return 0;
  }
  cdir_entries_on_this_disk = flags;
  _cdir_size = pZip;
  mVar2 = mz_zip_reader_locate_header_sig(pZip,0x6054b50,0x16,(mz_int64 *)&p);
  if (mVar2 == 0) {
    if (_cdir_size != (mz_zip_archive *)0x0) {
      _cdir_size->m_last_error = MZ_ZIP_FAILED_FINDING_CENTRAL_DIR;
    }
    return 0;
  }
  archive_ofs = (mz_uint64)p;
  sVar4 = (*_cdir_size->m_pRead)(_cdir_size->m_pIO_opaque,(mz_uint64)p,stack0xffffffffffffed50,0x16)
  ;
  if (sVar4 != 0x16) {
    if (_cdir_size != (mz_zip_archive *)0x0) {
      _cdir_size->m_last_error = MZ_ZIP_FILE_READ_FAILED;
    }
    return 0;
  }
  if (*(int *)stack0xffffffffffffed50 != 0x6054b50) {
    if (_cdir_size != (mz_zip_archive *)0x0) {
      _cdir_size->m_last_error = MZ_ZIP_NOT_AN_ARCHIVE;
    }
    return 0;
  }
  if (((0x4b < (long)p) &&
      (sVar4 = (*_cdir_size->m_pRead)
                         (_cdir_size->m_pIO_opaque,(mz_uint64)(p + -0x14),
                          (void *)zip64_end_of_central_dir_header_u32._48_8_,0x14), sVar4 == 0x14))
     && (*(int *)zip64_end_of_central_dir_header_u32._48_8_ == 0x7064b50)) {
    _cdir_size->m_pState->m_zip64 = 1;
  }
  if (_cdir_size->m_pState->m_zip64 != 0) {
    if ((long)p < 0x4c) {
      if (_cdir_size != (mz_zip_archive *)0x0) {
        _cdir_size->m_last_error = MZ_ZIP_NOT_AN_ARCHIVE;
      }
      return 0;
    }
    mVar2 = mz_zip_reader_eocd64_valid
                      (_cdir_size,(uint64_t)(p + -0x4c),(uint8_t *)&pZip64_end_of_central_dir);
    if (mVar2 == 0) {
      if (_cdir_size->m_archive_size - 0x38 <
          *(ulong *)(zip64_end_of_central_dir_header_u32._48_8_ + 8)) {
        if (_cdir_size != (mz_zip_archive *)0x0) {
          _cdir_size->m_last_error = MZ_ZIP_NOT_AN_ARCHIVE;
        }
        return 0;
      }
      mVar2 = mz_zip_reader_eocd64_valid
                        (_cdir_size,*(ulong *)(zip64_end_of_central_dir_header_u32._48_8_ + 8),
                         (uint8_t *)&pZip64_end_of_central_dir);
      if (mVar2 == 0) {
        if (_cdir_size != (mz_zip_archive *)0x0) {
          _cdir_size->m_last_error = MZ_ZIP_NOT_AN_ARCHIVE;
        }
        return 0;
      }
    }
  }
  _cdir_size->m_total_files = (uint)*(ushort *)((long)stack0xffffffffffffed50 + 10);
  cdir_disk_index = (mz_uint)*(ushort *)(stack0xffffffffffffed50 + 1);
  local_278 = (uint)*(ushort *)((long)stack0xffffffffffffed50 + 4);
  cdir_ofs._4_4_ = (uint)*(ushort *)((long)stack0xffffffffffffed50 + 6);
  num_this_disk = *(mz_uint *)((long)stack0xffffffffffffed50 + 0xc);
  eocd_ofs = (mz_uint64)*(uint *)(stack0xffffffffffffed50 + 2);
  if (_cdir_size->m_pState->m_zip64 != 0) {
    cdir_disk_index = zip64_end_of_central_dir_header_u32[4];
    num_this_disk = zip64_end_of_central_dir_header_u32[8];
    if (stack0xffffffffffffecfc < 0x2c) {
      if (_cdir_size != (mz_zip_archive *)0x0) {
        _cdir_size->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
      }
      return 0;
    }
    if (*(int *)(zip64_end_of_central_dir_header_u32._48_8_ + 0x10) != 1) {
      if (_cdir_size != (mz_zip_archive *)0x0) {
        _cdir_size->m_last_error = MZ_ZIP_UNSUPPORTED_MULTIDISK;
      }
      return 0;
    }
    if (0xffffffff <
        CONCAT44(zip64_end_of_central_dir_header_u32[7],zip64_end_of_central_dir_header_u32[6])) {
      if (_cdir_size != (mz_zip_archive *)0x0) {
        _cdir_size->m_last_error = MZ_ZIP_TOO_MANY_FILES;
      }
      return 0;
    }
    _cdir_size->m_total_files = zip64_end_of_central_dir_header_u32[6];
    if (0xffffffff <
        CONCAT44(zip64_end_of_central_dir_header_u32[5],zip64_end_of_central_dir_header_u32[4])) {
      if (_cdir_size != (mz_zip_archive *)0x0) {
        _cdir_size->m_last_error = MZ_ZIP_TOO_MANY_FILES;
      }
      return 0;
    }
    if (0xffffffff <
        CONCAT44(zip64_end_of_central_dir_header_u32[9],zip64_end_of_central_dir_header_u32[8])) {
      if (_cdir_size != (mz_zip_archive *)0x0) {
        _cdir_size->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
      }
      return 0;
    }
    local_278 = zip64_end_of_central_dir_header_u32[2];
    cdir_ofs._4_4_ = zip64_end_of_central_dir_header_u32[3];
    eocd_ofs._0_4_ = zip64_end_of_central_dir_header_u32[10];
    eocd_ofs._4_4_ = zip64_end_of_central_dir_header_u32[0xb];
  }
  if (_cdir_size->m_total_files != cdir_disk_index) {
    if (_cdir_size != (mz_zip_archive *)0x0) {
      _cdir_size->m_last_error = MZ_ZIP_UNSUPPORTED_MULTIDISK;
    }
    return 0;
  }
  if ((local_278 != 0 || cdir_ofs._4_4_ != 0) && ((local_278 != 1 || (cdir_ofs._4_4_ != 1)))) {
    if (_cdir_size != (mz_zip_archive *)0x0) {
      _cdir_size->m_last_error = MZ_ZIP_UNSUPPORTED_MULTIDISK;
    }
    return 0;
  }
  if ((ulong)num_this_disk < (ulong)_cdir_size->m_total_files * 0x2e) {
    if (_cdir_size != (mz_zip_archive *)0x0) {
      _cdir_size->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
    }
    return 0;
  }
  if (_cdir_size->m_archive_size < eocd_ofs + num_this_disk) {
    if (_cdir_size != (mz_zip_archive *)0x0) {
      _cdir_size->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
    }
    return 0;
  }
  if (archive_ofs < eocd_ofs + num_this_disk) {
    if (_cdir_size != (mz_zip_archive *)0x0) {
      _cdir_size->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
    }
    return 0;
  }
  cur_file_ofs = archive_ofs - (eocd_ofs + num_this_disk);
  if (_cdir_size->m_pState->m_zip64 != 0) {
    if ((ulong)cur_file_ofs < 0x4c) {
      if (_cdir_size != (mz_zip_archive *)0x0) {
        _cdir_size->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
      }
      return 0;
    }
    cur_file_ofs = cur_file_ofs - 0x4c;
  }
  if (((_cdir_size->m_zip_type == MZ_ZIP_TYPE_FILE) || (_cdir_size->m_zip_type == MZ_ZIP_TYPE_CFILE)
      ) && (_cdir_size->m_pState->m_file_archive_start_ofs == 0)) {
    _cdir_size->m_pState->m_file_archive_start_ofs = cur_file_ofs;
    _cdir_size->m_archive_size = _cdir_size->m_archive_size - cur_file_ofs;
  }
  _cdir_size->m_central_directory_file_ofs = eocd_ofs;
  if (_cdir_size->m_total_files == 0) {
LAB_0010d67f:
    if (zip64_end_of_central_dir_locator_u32[3] != 0) {
      mz_zip_reader_sort_central_dir_offsets_by_filename(_cdir_size);
    }
    pZip_local._0_4_ = 1;
  }
  else {
    local_20 = _cdir_size->m_pState;
    local_28 = (size_t)num_this_disk;
    local_18 = _cdir_size;
    local_2c = 0;
    if (((local_20->m_central_dir).m_capacity < local_28) &&
       (mVar2 = mz_zip_array_ensure_capacity(_cdir_size,&local_20->m_central_dir,local_28,0),
       mVar2 == 0)) {
      local_c = 0;
    }
    else {
      (local_20->m_central_dir).m_size = local_28;
      local_c = 1;
    }
    if (local_c != 0) {
      local_40 = &_cdir_size->m_pState->m_central_dir_offsets;
      local_48 = (ulong)_cdir_size->m_total_files;
      local_38 = _cdir_size;
      local_4c = 0;
      if (((_cdir_size->m_pState->m_central_dir_offsets).m_capacity < local_48) &&
         (mVar2 = mz_zip_array_ensure_capacity(_cdir_size,local_40,local_48,0), mVar2 == 0)) {
        local_30 = 0;
      }
      else {
        local_40->m_size = local_48;
        local_30 = 1;
      }
      if (local_30 != 0) {
        if (zip64_end_of_central_dir_locator_u32[3] != 0) {
          local_60 = &_cdir_size->m_pState->m_sorted_central_dir_offsets;
          local_68 = (ulong)_cdir_size->m_total_files;
          local_58 = _cdir_size;
          local_6c = 0;
          if (((_cdir_size->m_pState->m_sorted_central_dir_offsets).m_capacity < local_68) &&
             (mVar2 = mz_zip_array_ensure_capacity(_cdir_size,local_60,local_68,0), mVar2 == 0)) {
            local_50 = 0;
          }
          else {
            local_60->m_size = local_68;
            local_50 = 1;
          }
          if (local_50 == 0) {
            if (_cdir_size != (mz_zip_archive *)0x0) {
              _cdir_size->m_last_error = MZ_ZIP_ALLOC_FAILED;
            }
            return 0;
          }
        }
        sVar4 = (*_cdir_size->m_pRead)
                          (_cdir_size->m_pIO_opaque,eocd_ofs,
                           (_cdir_size->m_pState->m_central_dir).m_p,(size_t)num_this_disk);
        if (sVar4 != num_this_disk) {
          if (_cdir_size != (mz_zip_archive *)0x0) {
            _cdir_size->m_last_error = MZ_ZIP_FILE_READ_FAILED;
          }
          return 0;
        }
        buf_u32._4088_8_ = (_cdir_size->m_pState->m_central_dir).m_p;
        disk_index = num_this_disk;
        for (total_header_size = 0; total_header_size < _cdir_size->m_total_files;
            total_header_size = total_header_size + 1) {
          if ((disk_index < 0x2e) || (*(int *)buf_u32._4088_8_ != 0x2014b50)) {
            if (_cdir_size != (mz_zip_archive *)0x0) {
              _cdir_size->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
            }
            return 0;
          }
          *(mz_uint32 *)
           ((long)(_cdir_size->m_pState->m_central_dir_offsets).m_p + (ulong)total_header_size * 4)
               = (mz_uint32)buf_u32._4088_8_ - (int)(_cdir_size->m_pState->m_central_dir).m_p;
          if (zip64_end_of_central_dir_locator_u32[3] != 0) {
            *(mz_uint *)
             ((long)(_cdir_size->m_pState->m_sorted_central_dir_offsets).m_p +
             (ulong)total_header_size * 4) = total_header_size;
          }
          uVar5 = (ulong)*(uint *)(buf_u32._4088_8_ + 0x14);
          uVar6 = (ulong)*(uint *)(buf_u32._4088_8_ + 0x18);
          local_13b0 = (ulong)*(uint *)(buf_u32._4088_8_ + 0x2a);
          uVar3 = (uint)*(ushort *)(buf_u32._4088_8_ + 0x1c);
          uVar1 = *(ushort *)(buf_u32._4088_8_ + 0x1e);
          pExtra_data._4_4_ = (uint)uVar1;
          if ((_cdir_size->m_pState->m_zip64_has_extended_info_fields == 0) &&
             (pExtra_data._4_4_ != 0)) {
            local_13a0 = uVar6;
            if (uVar6 < uVar5) {
              local_13a0 = uVar5;
            }
            if (local_13b0 < local_13a0) {
              local_13a8 = uVar6;
              if (uVar6 < uVar5) {
                local_13a8 = uVar5;
              }
              local_13b0 = local_13a8;
            }
            if ((local_13b0 == 0xffffffff) && (pExtra_data._4_4_ != 0)) {
              _field_data_size = (void *)0x0;
              if (disk_index < uVar3 + 0x2e + pExtra_data._4_4_) {
                buf = malloc((ulong)pExtra_data._4_4_);
                if (buf == (void *)0x0) {
                  if (_cdir_size != (mz_zip_archive *)0x0) {
                    _cdir_size->m_last_error = MZ_ZIP_ALLOC_FAILED;
                  }
                  return 0;
                }
                sVar4 = (*_cdir_size->m_pRead)
                                  (_cdir_size->m_pIO_opaque,eocd_ofs + 0x2e + (ulong)uVar3,buf,
                                   (ulong)uVar1);
                _field_data_size = buf;
                if (sVar4 != pExtra_data._4_4_) {
                  free(buf);
                  if (_cdir_size != (mz_zip_archive *)0x0) {
                    _cdir_size->m_last_error = MZ_ZIP_FILE_READ_FAILED;
                  }
                  return 0;
                }
              }
              else {
                buf = (void *)(buf_u32._4088_8_ + 0x2e + (ulong)uVar3);
              }
              do {
                if (pExtra_data._4_4_ < 4) {
                  free(_field_data_size);
                  if (_cdir_size != (mz_zip_archive *)0x0) {
                    _cdir_size->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
                  }
                  return 0;
                }
                uVar3 = (uint)*(ushort *)((long)buf + 2);
                if (pExtra_data._4_4_ < uVar3 + 4) {
                  free(_field_data_size);
                  if (_cdir_size != (mz_zip_archive *)0x0) {
                    _cdir_size->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
                  }
                  return 0;
                }
                if (*buf == 1) {
                  _cdir_size->m_pState->m_zip64 = 1;
                  _cdir_size->m_pState->m_zip64_has_extended_info_fields = 1;
                  break;
                }
                buf = (void *)((ulong)uVar3 + 4 + (long)buf);
                pExtra_data._4_4_ = (pExtra_data._4_4_ - 4) - uVar3;
              } while (pExtra_data._4_4_ != 0);
              free(_field_data_size);
            }
          }
          if (((uVar5 != 0xffffffff) && (uVar6 != 0xffffffff)) &&
             (((*(int *)(buf_u32._4088_8_ + 10) == 0 && (uVar6 != uVar5)) ||
              ((uVar6 != 0 && (uVar5 == 0)))))) {
            if (_cdir_size != (mz_zip_archive *)0x0) {
              _cdir_size->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
            }
            return 0;
          }
          uVar3 = (uint)*(ushort *)(buf_u32._4088_8_ + 0x22);
          if ((uVar3 == 0xffff) || ((uVar3 != local_278 && (uVar3 != 1)))) {
            if (_cdir_size != (mz_zip_archive *)0x0) {
              _cdir_size->m_last_error = MZ_ZIP_UNSUPPORTED_MULTIDISK;
            }
            return 0;
          }
          if ((uVar5 != 0xffffffff) &&
             (_cdir_size->m_archive_size < (ulong)*(uint *)(buf_u32._4088_8_ + 0x2a) + 0x1e + uVar5)
             ) {
            if (_cdir_size != (mz_zip_archive *)0x0) {
              _cdir_size->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
            }
            return 0;
          }
          if ((*(ushort *)(buf_u32._4088_8_ + 8) & 0x2000) != 0) {
            if (_cdir_size != (mz_zip_archive *)0x0) {
              _cdir_size->m_last_error = MZ_ZIP_UNSUPPORTED_ENCRYPTION;
            }
            return 0;
          }
          uVar3 = *(ushort *)(buf_u32._4088_8_ + 0x1c) + 0x2e +
                  (uint)*(ushort *)(buf_u32._4088_8_ + 0x1e) +
                  (uint)*(ushort *)(buf_u32._4088_8_ + 0x20);
          if (disk_index < uVar3) {
            if (_cdir_size != (mz_zip_archive *)0x0) {
              _cdir_size->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
            }
            return 0;
          }
          disk_index = disk_index - uVar3;
          buf_u32._4088_8_ = buf_u32._4088_8_ + (ulong)uVar3;
        }
        goto LAB_0010d67f;
      }
    }
    if (_cdir_size != (mz_zip_archive *)0x0) {
      _cdir_size->m_last_error = MZ_ZIP_ALLOC_FAILED;
    }
    pZip_local._0_4_ = 0;
  }
  return (mz_bool)pZip_local;
}

Assistant:

static mz_bool mz_zip_reader_read_central_dir(mz_zip_archive *pZip,
                                              mz_uint flags) {
  mz_uint cdir_size = 0, cdir_entries_on_this_disk = 0, num_this_disk = 0,
          cdir_disk_index = 0;
  mz_uint64 cdir_ofs = 0, eocd_ofs = 0, archive_ofs = 0;
  mz_int64 cur_file_ofs = 0;
  const mz_uint8 *p;

  mz_uint32 buf_u32[4096 / sizeof(mz_uint32)];
  mz_uint8 *pBuf = (mz_uint8 *)buf_u32;
  mz_bool sort_central_dir =
      ((flags & MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY) == 0);
  mz_uint32 zip64_end_of_central_dir_locator_u32
      [(MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE + sizeof(mz_uint32) - 1) /
       sizeof(mz_uint32)];
  mz_uint8 *pZip64_locator = (mz_uint8 *)zip64_end_of_central_dir_locator_u32;

  mz_uint32 zip64_end_of_central_dir_header_u32
      [(MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) /
       sizeof(mz_uint32)];
  mz_uint8 *pZip64_end_of_central_dir =
      (mz_uint8 *)zip64_end_of_central_dir_header_u32;

  mz_uint64 zip64_end_of_central_dir_ofs = 0;

  /* Basic sanity checks - reject files which are too small, and check the first
   * 4 bytes of the file to make sure a local header is there. */
  if (pZip->m_archive_size < MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
    return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

  if (!mz_zip_reader_locate_header_sig(
          pZip, MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG,
          MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE, &cur_file_ofs))
    return mz_zip_set_error(pZip, MZ_ZIP_FAILED_FINDING_CENTRAL_DIR);

  eocd_ofs = cur_file_ofs;
  /* Read and verify the end of central directory record. */
  if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pBuf,
                    MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE) !=
      MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
    return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

  if (MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_SIG_OFS) !=
      MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG)
    return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

  if (cur_file_ofs >= (MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE +
                       MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE)) {
    if (pZip->m_pRead(pZip->m_pIO_opaque,
                      cur_file_ofs - MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE,
                      pZip64_locator,
                      MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE) ==
        MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE) {
      if (MZ_READ_LE32(pZip64_locator + MZ_ZIP64_ECDL_SIG_OFS) ==
          MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIG) {
        pZip->m_pState->m_zip64 = MZ_TRUE;
      }
    }
  }

  if (pZip->m_pState->m_zip64) {
    /* Try locating the EOCD64 right before the EOCD64 locator. This works even
     * when the effective start of the zip header is not yet known. */
    if (cur_file_ofs < MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE +
                           MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE)
      return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

    zip64_end_of_central_dir_ofs = cur_file_ofs -
                                   MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE -
                                   MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE;

    if (!mz_zip_reader_eocd64_valid(pZip, zip64_end_of_central_dir_ofs,
                                    pZip64_end_of_central_dir)) {
      /* That failed, try reading where the locator tells us to. */
      zip64_end_of_central_dir_ofs = MZ_READ_LE64(
          pZip64_locator + MZ_ZIP64_ECDL_REL_OFS_TO_ZIP64_ECDR_OFS);

      if (zip64_end_of_central_dir_ofs >
          (pZip->m_archive_size - MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE))
        return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

      if (!mz_zip_reader_eocd64_valid(pZip, zip64_end_of_central_dir_ofs,
                                      pZip64_end_of_central_dir))
        return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);
    }
  }

  pZip->m_total_files = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_CDIR_TOTAL_ENTRIES_OFS);
  cdir_entries_on_this_disk =
      MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS);
  num_this_disk = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_NUM_THIS_DISK_OFS);
  cdir_disk_index = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_NUM_DISK_CDIR_OFS);
  cdir_size = MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_CDIR_SIZE_OFS);
  cdir_ofs = MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_CDIR_OFS_OFS);

  if (pZip->m_pState->m_zip64) {
    mz_uint32 zip64_total_num_of_disks =
        MZ_READ_LE32(pZip64_locator + MZ_ZIP64_ECDL_TOTAL_NUMBER_OF_DISKS_OFS);
    mz_uint64 zip64_cdir_total_entries = MZ_READ_LE64(
        pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_TOTAL_ENTRIES_OFS);
    mz_uint64 zip64_cdir_total_entries_on_this_disk = MZ_READ_LE64(
        pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS);
    mz_uint64 zip64_size_of_end_of_central_dir_record = MZ_READ_LE64(
        pZip64_end_of_central_dir + MZ_ZIP64_ECDH_SIZE_OF_RECORD_OFS);
    mz_uint64 zip64_size_of_central_directory =
        MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_SIZE_OFS);

    if (zip64_size_of_end_of_central_dir_record <
        (MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE - 12))
      return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    if (zip64_total_num_of_disks != 1U)
      return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

    /* Check for miniz's practical limits */
    if (zip64_cdir_total_entries > MZ_UINT32_MAX)
      return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);

    pZip->m_total_files = (mz_uint32)zip64_cdir_total_entries;

    if (zip64_cdir_total_entries_on_this_disk > MZ_UINT32_MAX)
      return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);

    cdir_entries_on_this_disk =
        (mz_uint32)zip64_cdir_total_entries_on_this_disk;

    /* Check for miniz's current practical limits (sorry, this should be enough
     * for millions of files) */
    if (zip64_size_of_central_directory > MZ_UINT32_MAX)
      return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

    cdir_size = (mz_uint32)zip64_size_of_central_directory;

    num_this_disk = MZ_READ_LE32(pZip64_end_of_central_dir +
                                 MZ_ZIP64_ECDH_NUM_THIS_DISK_OFS);

    cdir_disk_index = MZ_READ_LE32(pZip64_end_of_central_dir +
                                   MZ_ZIP64_ECDH_NUM_DISK_CDIR_OFS);

    cdir_ofs =
        MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_OFS_OFS);
  }

  if (pZip->m_total_files != cdir_entries_on_this_disk)
    return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

  if (((num_this_disk | cdir_disk_index) != 0) &&
      ((num_this_disk != 1) || (cdir_disk_index != 1)))
    return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

  if (cdir_size <
      (mz_uint64)pZip->m_total_files * MZ_ZIP_CENTRAL_DIR_HEADER_SIZE)
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

  if ((cdir_ofs + (mz_uint64)cdir_size) > pZip->m_archive_size)
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

  if (eocd_ofs < cdir_ofs + cdir_size)
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

  /* The end of central dir follows the central dir, unless the zip file has
   * some trailing data (e.g. it is appended to an executable file). */
  archive_ofs = eocd_ofs - (cdir_ofs + cdir_size);
  if (pZip->m_pState->m_zip64) {
    if (archive_ofs < MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE +
                          MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE)
      return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    archive_ofs -= MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE +
                   MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE;
  }

  /* Update the archive start position, but only if not specified. */
  if ((pZip->m_zip_type == MZ_ZIP_TYPE_FILE ||
       pZip->m_zip_type == MZ_ZIP_TYPE_CFILE) &&
      pZip->m_pState->m_file_archive_start_ofs == 0) {
    pZip->m_pState->m_file_archive_start_ofs = archive_ofs;
    pZip->m_archive_size -= archive_ofs;
  }

  pZip->m_central_directory_file_ofs = cdir_ofs;

  if (pZip->m_total_files) {
    mz_uint i, n;
    /* Read the entire central directory into a heap block, and allocate another
     * heap block to hold the unsorted central dir file record offsets, and
     * possibly another to hold the sorted indices. */
    if ((!mz_zip_array_resize(pZip, &pZip->m_pState->m_central_dir, cdir_size,
                              MZ_FALSE)) ||
        (!mz_zip_array_resize(pZip, &pZip->m_pState->m_central_dir_offsets,
                              pZip->m_total_files, MZ_FALSE)))
      return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

    if (sort_central_dir) {
      if (!mz_zip_array_resize(pZip,
                               &pZip->m_pState->m_sorted_central_dir_offsets,
                               pZip->m_total_files, MZ_FALSE))
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    }

    if (pZip->m_pRead(pZip->m_pIO_opaque, cdir_ofs,
                      pZip->m_pState->m_central_dir.m_p,
                      cdir_size) != cdir_size)
      return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

    /* Now create an index into the central directory file records, do some
     * basic sanity checking on each record */
    p = (const mz_uint8 *)pZip->m_pState->m_central_dir.m_p;
    for (n = cdir_size, i = 0; i < pZip->m_total_files; ++i) {
      mz_uint total_header_size, disk_index, bit_flags, filename_size,
          ext_data_size;
      mz_uint64 comp_size, decomp_size, local_header_ofs;

      if ((n < MZ_ZIP_CENTRAL_DIR_HEADER_SIZE) ||
          (MZ_READ_LE32(p) != MZ_ZIP_CENTRAL_DIR_HEADER_SIG))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

      MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets, mz_uint32,
                           i) =
          (mz_uint32)(p - (const mz_uint8 *)pZip->m_pState->m_central_dir.m_p);

      if (sort_central_dir)
        MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_sorted_central_dir_offsets,
                             mz_uint32, i) = i;

      comp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS);
      decomp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS);
      local_header_ofs = MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS);
      filename_size = MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS);
      ext_data_size = MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS);

      if ((!pZip->m_pState->m_zip64_has_extended_info_fields) &&
          (ext_data_size) &&
          (MZ_MAX(MZ_MAX(comp_size, decomp_size), local_header_ofs) ==
           MZ_UINT32_MAX)) {
        /* Attempt to find zip64 extended information field in the entry's extra
         * data */
        mz_uint32 extra_size_remaining = ext_data_size;

        if (extra_size_remaining) {
          const mz_uint8 *pExtra_data;
          void *buf = NULL;

          if (MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + filename_size + ext_data_size >
              n) {
            buf = MZ_MALLOC(ext_data_size);
            if (buf == NULL)
              return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

            if (pZip->m_pRead(pZip->m_pIO_opaque,
                              cdir_ofs + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE +
                                  filename_size,
                              buf, ext_data_size) != ext_data_size) {
              MZ_FREE(buf);
              return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            }

            pExtra_data = (mz_uint8 *)buf;
          } else {
            pExtra_data = p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + filename_size;
          }

          do {
            mz_uint32 field_id;
            mz_uint32 field_data_size;

            if (extra_size_remaining < (sizeof(mz_uint16) * 2)) {
              MZ_FREE(buf);
              return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            field_id = MZ_READ_LE16(pExtra_data);
            field_data_size = MZ_READ_LE16(pExtra_data + sizeof(mz_uint16));

            if ((field_data_size + sizeof(mz_uint16) * 2) >
                extra_size_remaining) {
              MZ_FREE(buf);
              return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            if (field_id == MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID) {
              /* Ok, the archive didn't have any zip64 headers but it uses a
               * zip64 extended information field so mark it as zip64 anyway
               * (this can occur with infozip's zip util when it reads
               * compresses files from stdin). */
              pZip->m_pState->m_zip64 = MZ_TRUE;
              pZip->m_pState->m_zip64_has_extended_info_fields = MZ_TRUE;
              break;
            }

            pExtra_data += sizeof(mz_uint16) * 2 + field_data_size;
            extra_size_remaining =
                extra_size_remaining - sizeof(mz_uint16) * 2 - field_data_size;
          } while (extra_size_remaining);

          MZ_FREE(buf);
        }
      }

      /* I've seen archives that aren't marked as zip64 that uses zip64 ext
       * data, argh */
      if ((comp_size != MZ_UINT32_MAX) && (decomp_size != MZ_UINT32_MAX)) {
        if (((!MZ_READ_LE32(p + MZ_ZIP_CDH_METHOD_OFS)) &&
             (decomp_size != comp_size)) ||
            (decomp_size && !comp_size))
          return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
      }

      disk_index = MZ_READ_LE16(p + MZ_ZIP_CDH_DISK_START_OFS);
      if ((disk_index == MZ_UINT16_MAX) ||
          ((disk_index != num_this_disk) && (disk_index != 1)))
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

      if (comp_size != MZ_UINT32_MAX) {
        if (((mz_uint64)MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS) +
             MZ_ZIP_LOCAL_DIR_HEADER_SIZE + comp_size) > pZip->m_archive_size)
          return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
      }

      bit_flags = MZ_READ_LE16(p + MZ_ZIP_CDH_BIT_FLAG_OFS);
      if (bit_flags & MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_LOCAL_DIR_IS_MASKED)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_ENCRYPTION);

      if ((total_header_size = MZ_ZIP_CENTRAL_DIR_HEADER_SIZE +
                               MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS) +
                               MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS) +
                               MZ_READ_LE16(p + MZ_ZIP_CDH_COMMENT_LEN_OFS)) >
          n)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

      n -= total_header_size;
      p += total_header_size;
    }
  }

  if (sort_central_dir)
    mz_zip_reader_sort_central_dir_offsets_by_filename(pZip);

  return MZ_TRUE;
}